

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapePiram>::ComputeMasterDirections(TPZShapeData *data)

{
  TPZFNMatrix<243,_double> *this;
  int iVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  int il;
  long row;
  int side;
  double local_118;
  TPZFNMatrix<9,_double> gradx;
  
  this = &data->fMasterDirections;
  TPZFMatrix<double>::Resize(&this->super_TPZFMatrix<double>,3,0x39);
  local_118 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradx,3,3,&local_118);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    pdVar4 = TPZFMatrix<double>::operator()(&gradx.super_TPZFMatrix<double>,lVar7,lVar7);
    *pdVar4 = 1.0;
  }
  pztopology::TPZPyramid::ComputeHDivDirections<double>
            (&gradx.super_TPZFMatrix<double>,&this->super_TPZFMatrix<double>);
  iVar3 = 0;
  for (lVar7 = 0xd; lVar7 != 0x12; lVar7 = lVar7 + 1) {
    uVar2 = pztopology::TPZPyramid::NContainedSides((int)lVar7);
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      for (row = 0; row != 3; row = row + 1) {
        iVar1 = (data->fSideOrient).super_TPZVec<int>.fStore[lVar7 + -0xd];
        pdVar4 = TPZFMatrix<double>::operator()
                           (&this->super_TPZFMatrix<double>,row,uVar6 + (long)iVar3);
        *pdVar4 = (double)iVar1 * *pdVar4;
      }
    }
    iVar3 = iVar3 + uVar2;
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradx);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeMasterDirections(TPZShapeData &data)
{
    int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    data.fMasterDirections.Resize(3,numvec);
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    for (int i = 0; i < TSHAPE::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TSHAPE::ComputeHDivDirections(gradx, data.fMasterDirections);
    
    int firstface = TSHAPE::NSides - TSHAPE::NFacets - 1;
    int lastface = TSHAPE::NSides - 1;
    int cont = 0;
    for(int side = firstface; side < lastface; side++)
    {
        int nvec = TSHAPE::NContainedSides(side);
        for (int ivet = 0; ivet<nvec; ivet++)
        {
            for (int il = 0; il<dim; il++)
            {
              data.fMasterDirections(il,ivet+cont) *= data.fSideOrient[side-firstface];
            }
        }
        cont += nvec;
    }
    
}